

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

JSON __thiscall
qpdf::Stream::getStreamJSON
          (Stream *this,int json_version,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename)

{
  qpdf_stream_decode_level_e decode_level_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  JSON JVar1;
  string *in_stack_00000008;
  Stream local_140;
  StreamBlobProvider local_130;
  function<void_(Pipeline_*)> local_118;
  JSON local_f8;
  allocator<char> local_e1;
  JSON local_e0 [2];
  JSON local_c0;
  string local_b0;
  undefined1 local_8d;
  undefined1 local_80 [8];
  Writer jw;
  Pl_Buffer pb;
  Pipeline *p_local;
  qpdf_stream_decode_level_e decode_level_local;
  qpdf_json_stream_data_e json_data_local;
  int json_version_local;
  Stream *this_local;
  JSON *result;
  
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&jw.indent,"streamjson",(Pipeline *)0x0);
  JSON::Writer::Writer((Writer *)local_80,(Pipeline *)&jw.indent,0);
  decode_level_00 =
       writeStreamJSON((Stream *)CONCAT44(in_register_00000034,json_version),json_data,
                       (Writer *)local_80,decode_level,(qpdf_stream_decode_level_e)p,
                       (Pipeline *)data_filename,in_stack_00000008,true);
  Pl_Buffer::finish((Pl_Buffer *)&jw.indent);
  local_8d = 0;
  Pl_Buffer::getString_abi_cxx11_(&local_b0,(Pl_Buffer *)&jw.indent);
  JSON::parse((JSON *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (decode_level == qpdf_dl_generalized) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"data",&local_e1);
    Stream(&local_140,(Stream *)CONCAT44(in_register_00000034,json_version));
    anon_unknown.dwarf_517483::StreamBlobProvider::StreamBlobProvider
              (&local_130,&local_140,decode_level_00);
    std::function<void(Pipeline*)>::function<(anonymous_namespace)::StreamBlobProvider,void>
              ((function<void(Pipeline*)> *)&local_118,&local_130);
    JSON::makeBlob(&local_f8,&local_118);
    JSON::addDictionaryMember(&local_c0,(string *)this,local_e0);
    JSON::~JSON(&local_c0);
    JSON::~JSON(&local_f8);
    std::function<void_(Pipeline_*)>::~function(&local_118);
    anon_unknown.dwarf_517483::StreamBlobProvider::~StreamBlobProvider(&local_130);
    ~Stream(&local_140);
    std::__cxx11::string::~string((string *)local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  local_8d = 1;
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&jw.indent);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
Stream::getStreamJSON(
    int json_version,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename)
{
    Pl_Buffer pb{"streamjson"};
    JSON::Writer jw{&pb, 0};
    decode_level =
        writeStreamJSON(json_version, jw, json_data, decode_level, p, data_filename, true);
    pb.finish();
    auto result = JSON::parse(pb.getString());
    if (json_data == qpdf_sj_inline) {
        result.addDictionaryMember("data", JSON::makeBlob(StreamBlobProvider(*this, decode_level)));
    }
    return result;
}